

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O0

int nn_xrep_send(nn_sockbase *self,nn_msg *msg)

{
  FILE *__stream;
  uint32_t key_00;
  uint uVar1;
  size_t sVar2;
  uint8_t *buf;
  nn_hash_item *pnVar3;
  char *pcVar4;
  nn_list_item **local_48;
  nn_sockbase *local_40;
  nn_xrep_data *data;
  nn_xrep *xrep;
  uint32_t key;
  int rc;
  nn_msg *msg_local;
  nn_sockbase *self_local;
  
  local_40 = self;
  if (self == (nn_sockbase *)0x0) {
    local_40 = (nn_sockbase *)0x0;
  }
  sVar2 = nn_chunkref_size(&msg->sphdr);
  if (sVar2 < 4) {
    nn_msg_term(msg);
  }
  else {
    buf = (uint8_t *)nn_chunkref_data(&msg->sphdr);
    key_00 = nn_getl(buf);
    nn_chunkref_trim(&msg->sphdr,4);
    nn_mutex_lock((nn_mutex *)(local_40 + 0x1b));
    pnVar3 = nn_hash_get((nn_hash *)&local_40[1].sock,key_00);
    if (pnVar3 == (nn_hash_item *)0x0) {
      local_48 = (nn_list_item **)0x0;
    }
    else {
      pnVar3 = nn_hash_get((nn_hash *)&local_40[1].sock,key_00);
      local_48 = &pnVar3[-1].list.prev;
    }
    nn_mutex_unlock((nn_mutex *)(local_40 + 0x1b));
    if ((local_48 == (nn_list_item **)0x0) || ((*(uint *)(local_48 + 8) & 1) == 0)) {
      nn_msg_term(msg);
    }
    else {
      uVar1 = nn_pipe_send((nn_pipe *)*local_48,msg);
      __stream = _stderr;
      if ((int)uVar1 < 0) {
        pcVar4 = nn_err_strerror(-uVar1);
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar4,(ulong)-uVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/reqrep/xrep.c"
                ,0xc0);
        fflush(_stderr);
        nn_err_abort();
      }
      if ((uVar1 & 1) != 0) {
        *(uint *)(local_48 + 8) = *(uint *)(local_48 + 8) & 0xfffffffe;
      }
    }
  }
  return 0;
}

Assistant:

int nn_xrep_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    uint32_t key;
    struct nn_xrep *xrep;
    struct nn_xrep_data *data;

    xrep = nn_cont (self, struct nn_xrep, sockbase);

    /*  We treat invalid peer ID as if the peer was non-existent. */
    if (nn_slow (nn_chunkref_size (&msg->sphdr) < sizeof (uint32_t))) {
        nn_msg_term (msg);
        return 0;
    }

    /*  Retrieve the destination peer ID. Trim it from the header. */
    key = nn_getl (nn_chunkref_data (&msg->sphdr));
    nn_chunkref_trim (&msg->sphdr, 4);

    /*  Find the appropriate pipe to send the message to. If there's none,
        or if it's not ready for sending, silently drop the message. */
    nn_mutex_lock(&xrep->sync);
    data = nn_cont (nn_hash_get (&xrep->outpipes, key), struct nn_xrep_data,
        outitem);
    nn_mutex_unlock(&xrep->sync);
    if (!data || !(data->flags & NN_XREP_OUT)) {
        nn_msg_term (msg);
        return 0;
    }

    /*  Send the message. */
    rc = nn_pipe_send (data->pipe, msg);
    errnum_assert (rc >= 0, -rc);
    if (rc & NN_PIPE_RELEASE)
        data->flags &= ~NN_XREP_OUT;

    return 0;
}